

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

KeyOriginInfo * DeserializeKeyOrigin<DataStream>(DataStream *s,uint64_t length)

{
  long lVar1;
  error_code *this;
  ulong in_RDX;
  KeyOriginInfo *in_RDI;
  long in_FS_OFFSET;
  uint i;
  KeyOriginInfo *hd_keypath;
  uint32_t index;
  KeyOriginInfo *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  io_errc in_stack_ffffffffffffff84;
  DataStream *in_stack_ffffffffffffff88;
  error_code *peVar2;
  uint local_4c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDX & 3) == 0) && (in_RDX != 0)) {
    KeyOriginInfo::KeyOriginInfo(in_stack_ffffffffffffff78);
    DataStream::operator>>
              (in_stack_ffffffffffffff88,
               (uchar (*) [4])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    for (local_4c = 4; local_4c < in_RDX; local_4c = local_4c + 4) {
      DataStream::operator>>
                (in_stack_ffffffffffffff88,
                 (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff88,
                 (value_type_conflict5 *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  else {
    this = (error_code *)__cxa_allocate_exception(0x20);
    peVar2 = this;
    std::error_code::error_code<std::io_errc,void>(this,in_stack_ffffffffffffff84);
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)this,(error_code *)"Invalid length for HD key path");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(peVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

KeyOriginInfo DeserializeKeyOrigin(Stream& s, uint64_t length)
{
    // Read in key path
    if (length % 4 || length == 0) {
        throw std::ios_base::failure("Invalid length for HD key path");
    }

    KeyOriginInfo hd_keypath;
    s >> hd_keypath.fingerprint;
    for (unsigned int i = 4; i < length; i += sizeof(uint32_t)) {
        uint32_t index;
        s >> index;
        hd_keypath.path.push_back(index);
    }
    return hd_keypath;
}